

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void __thiscall ByteCodeGenerator::AssignFrameSlotsRegister(ByteCodeGenerator *this)

{
  Type pFVar1;
  RegSlot RVar2;
  Type *ppFVar3;
  
  ppFVar3 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this->funcInfoStack->
                        super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  pFVar1 = *ppFVar3;
  if (pFVar1->frameSlotsRegister == 0xffffffff) {
    ppFVar3 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                        (&this->funcInfoStack->
                          super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    RVar2 = FuncInfo::NextVarRegister(*ppFVar3);
    pFVar1->frameSlotsRegister = RVar2;
  }
  return;
}

Assistant:

void ByteCodeGenerator::AssignFrameSlotsRegister()
{
    FuncInfo* top = funcInfoStack->Top();
    if (top->frameSlotsRegister == Js::Constants::NoRegister)
    {
        top->frameSlotsRegister = NextVarRegister();
    }
}